

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::cliquePartition
          (HighsCliqueTable *this,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clqVars
          ,vector<int,_std::allocator<int>_> *partitionStart)

{
  CliqueVar *pCVar1;
  pointer piVar2;
  int iVar3;
  HighsInt HVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  HighsInt numClqVars;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  int local_58;
  int local_54;
  vector<int,_std::allocator<int>_> *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  pCVar1 = (clqVars->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
            (&this->randgen,pCVar1,
             (HighsInt)
             ((ulong)((long)(clqVars->
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) >> 2));
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&local_48,
             (long)(clqVars->
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(clqVars->
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 2);
  uVar7 = (long)(clqVars->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(clqVars->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_start >> 2;
  iVar6 = (int)uVar7;
  piVar2 = (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_54 = iVar6;
  std::vector<int,_std::allocator<int>_>::reserve(partitionStart,uVar7);
  local_58 = 0;
  local_50 = partitionStart;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(partitionStart,&local_58);
  local_58 = 0;
  uVar7 = uVar7 & 0xffffffff;
  while( true ) {
    if (iVar6 <= local_58) break;
    iVar3 = (int)uVar7;
    if (local_58 == (int)uVar7) {
      std::vector<int,_std::allocator<int>_>::push_back(local_50,&local_58);
      iVar3 = iVar6;
    }
    pCVar1 = (clqVars->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_start + local_58;
    iVar5 = local_58 + 1;
    HVar4 = partitionNeighbourhood
                      (this,(vector<int,_std::allocator<int>_> *)&local_48,
                       &this->numNeighbourhoodQueries,*pCVar1,pCVar1 + 1,iVar3 - iVar5);
    uVar7 = (ulong)(uint)(HVar4 + iVar5);
    local_58 = local_58 + 1;
  }
  std::vector<int,_std::allocator<int>_>::push_back(local_50,&local_54);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void HighsCliqueTable::cliquePartition(std::vector<CliqueVar>& clqVars,
                                       std::vector<HighsInt>& partitionStart) {
  randgen.shuffle(clqVars.data(), clqVars.size());

  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(clqVars.size());

  HighsInt numClqVars = clqVars.size();
  partitionStart.clear();
  partitionStart.reserve(clqVars.size());
  HighsInt extensionEnd = numClqVars;
  partitionStart.push_back(0);
  for (HighsInt i = 0; i < numClqVars; ++i) {
    if (i == extensionEnd) {
      partitionStart.push_back(i);
      extensionEnd = numClqVars;
    }
    CliqueVar v = clqVars[i];
    HighsInt extensionStart = i + 1;
    extensionEnd =
        partitionNeighbourhood(neighbourhoodInds, numNeighbourhoodQueries, v,
                               clqVars.data() + extensionStart,
                               extensionEnd - extensionStart) +
        extensionStart;
  }

  partitionStart.push_back(numClqVars);
}